

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O1

void __thiscall
LASquadtree::raster_occupancy
          (LASquadtree *this,_func_BOOL_I32 *does_cell_exist,U32 *data,U32 min_x,U32 min_y,
          U32 level_index,U32 level,U32 stop_level)

{
  char cVar1;
  byte bVar2;
  BOOL BVar3;
  uint uVar4;
  U32 min_x_00;
  long lVar5;
  uint uVar6;
  int iVar7;
  U32 level_00;
  char cVar8;
  int iVar9;
  int local_7c;
  
  bVar2 = (byte)stop_level;
  cVar1 = bVar2 - (char)level;
  local_7c = level * 2;
  cVar8 = -1;
  lVar5 = 0;
  while( true ) {
    iVar9 = (int)lVar5;
    if (this->sub_level == 0) {
      uVar6 = this->level_offset[(ulong)level + lVar5] + level_index;
    }
    else {
      uVar6 = (this->sub_level_index << ((byte)local_7c & 0x1f)) + level_index +
              this->level_offset[this->sub_level + level + iVar9];
    }
    if ((this->adaptive[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) == 0) break;
    if (stop_level <= level + iVar9) {
      iVar9 = 1 << (cVar1 - (char)lVar5 & 0x1fU);
      uVar6 = iVar9 + min_y;
      if (min_y < uVar6) {
        do {
          uVar4 = (min_y << (bVar2 & 0x1f)) + min_x;
          iVar7 = iVar9;
          do {
            data[uVar4 >> 5] = data[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 + 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          min_y = min_y + 1;
        } while (min_y != uVar6);
      }
      return;
    }
    level_00 = level + iVar9 + 1;
    iVar9 = 1 << (cVar1 + cVar8 & 0x1fU);
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,level_index * 4,level_00,stop_level);
    min_x_00 = iVar9 + min_x;
    raster_occupancy(this,does_cell_exist,data,min_x_00,min_y,level_index * 4 + 1,level_00,
                     stop_level);
    min_y = iVar9 + min_y;
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,level_index * 4 + 2,level_00,stop_level);
    level_index = level_index * 4 + 3;
    lVar5 = lVar5 + 1;
    cVar8 = cVar8 + -1;
    local_7c = local_7c + 2;
    min_x = min_x_00;
  }
  BVar3 = (*does_cell_exist)(uVar6);
  if (!BVar3) {
    return;
  }
  iVar9 = 1 << (cVar1 - (char)lVar5 & 0x1fU);
  uVar6 = iVar9 + min_y;
  if (uVar6 <= min_y) {
    return;
  }
  do {
    uVar4 = (min_y << (bVar2 & 0x1f)) + min_x;
    iVar7 = iVar9;
    do {
      data[uVar4 >> 5] = data[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
      uVar4 = uVar4 + 1;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    min_y = min_y + 1;
  } while (min_y != uVar6);
  return;
}

Assistant:

void LASquadtree::raster_occupancy(BOOL(*does_cell_exist)(I32), U32* data, U32 min_x, U32 min_y, U32 level_index, U32 level, U32 stop_level) const
{
  U32 cell_index = get_cell_index(level_index, level);
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  // have we reached a leaf
  if (adaptive[adaptive_pos] & adaptive_bit) // interior node
  {
    if (level < stop_level) // do we need to continue
    {
      level_index <<= 2;
      level += 1;
      U32 size = 1 << (stop_level-level);
      // recurse into the four children
      raster_occupancy(does_cell_exist, data, min_x, min_y, level_index, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y, level_index + 1, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x, min_y+size, level_index + 2, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y+size, level_index + 3, level, stop_level);
      return;
    }
    else // no ... raster remaining subtree
    {
      U32 full_size = (1 << stop_level);
      U32 size = 1 << (stop_level-level);
      U32 max_y = min_y + size;
      U32 pos, pos_x, pos_y;
      for (pos_y = min_y; pos_y < max_y; pos_y++)
      {
        pos = pos_y*full_size + min_x;
        for (pos_x = 0; pos_x < size; pos_x++)
        {
          data[pos/32] |= (1<<(pos%32));
          pos++;
        }
      }
    }
  }
  else if (does_cell_exist(cell_index))
  {
    // raster actual cell
    U32 full_size = (1 << stop_level);
    U32 size = 1 << (stop_level-level);
    U32 max_y = min_y + size;
    U32 pos, pos_x, pos_y;
    for (pos_y = min_y; pos_y < max_y; pos_y++)
    {
      pos = pos_y*full_size + min_x;
      for (pos_x = 0; pos_x < size; pos_x++)
      {
        data[pos/32] |= (1<<(pos%32));
        pos++;
      }
    }
  }
}